

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0TlvFogTri::emulate_mthd(MthdEmuEmuD3D0TlvFogTri *this)

{
  uint32_t uVar1;
  MthdEmuEmuD3D0TlvFogTri *this_local;
  
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    uVar1 = pgraph_idx_ubyte_to_float
                      ((uint8_t)((this->super_SingleMthdTest).super_MthdTest.val >> 0x10));
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[8] = uVar1;
    uVar1 = pgraph_idx_ubyte_to_float
                      ((uint8_t)((this->super_SingleMthdTest).super_MthdTest.val >> 8));
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[9] = uVar1;
    uVar1 = pgraph_idx_ubyte_to_float((uint8_t)(this->super_SingleMthdTest).super_MthdTest.val);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[10] = uVar1;
    uVar1 = pgraph_idx_ubyte_to_float
                      ((uint8_t)((this->super_SingleMthdTest).super_MthdTest.val >> 0x18));
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[0xb] = uVar1;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc24[2] =
       (this->super_SingleMthdTest).super_MthdTest.val & 0xffffff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffffff80 | 1;
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			exp.celsius_pipe_vtx[8] = pgraph_idx_ubyte_to_float(extr(val, 16, 8));
			exp.celsius_pipe_vtx[9] = pgraph_idx_ubyte_to_float(extr(val, 8, 8));
			exp.celsius_pipe_vtx[10] = pgraph_idx_ubyte_to_float(extr(val, 0, 8));
			exp.celsius_pipe_vtx[11] = pgraph_idx_ubyte_to_float(extr(val, 24, 8));
		}
		exp.misc24[2] = val & 0xffffff;
		insrt(exp.valid[1], 0, 7, 1);
	}